

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_OpenDoor(FParser *this)

{
  bool bVar1;
  int tag;
  int iVar2;
  EVlDoor type;
  int local_18;
  int sectag;
  int wait_time;
  int speed;
  FParser *this_local;
  
  bVar1 = CheckArgs(this,1);
  if ((bVar1) && (tag = intvalue(this->t_argv), tag != 0)) {
    if (this->t_argc < 2) {
      local_18 = 0;
    }
    else {
      iVar2 = intvalue(this->t_argv + 1);
      local_18 = (iVar2 * 0x23) / 100;
    }
    if (this->t_argc < 3) {
      sectag = 1;
    }
    else {
      sectag = intvalue(this->t_argv + 2);
    }
    type = doorOpen;
    if (local_18 != 0) {
      type = doorRaise;
    }
    iVar2 = clamp<int>(sectag,1,0x7f);
    EV_DoDoor(type,(line_t_conflict *)0x0,(AActor *)0x0,tag,(double)iVar2 * 2.0,local_18,0,0,false,0
             );
  }
  return;
}

Assistant:

void FParser::SF_OpenDoor(void)
{
	int speed, wait_time;
	int sectag;
	
	if (CheckArgs(1))
	{
		// got sector tag
		sectag = intvalue(t_argv[0]);
		if (sectag==0) return;	// tag 0 not allowed
		
		// door wait time
		if(t_argc > 1) wait_time = (intvalue(t_argv[1]) * TICRATE) / 100;
		else wait_time = 0;  // 0= stay open
		
		// door speed
		if(t_argc > 2) speed = intvalue(t_argv[2]);
		else speed = 1;    // 1= normal speed

		EV_DoDoor(wait_time ? DDoor::doorRaise : DDoor::doorOpen, NULL, NULL, sectag, 2. * clamp(speed, 1, 127), wait_time, 0, 0);
	}
}